

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::Return_AST_Node::eval_internal(Return_AST_Node *this,Dispatch_State *t_ss)

{
  bool bVar1;
  Return_Value *this_00;
  Boxed_Value *t_return_value;
  long in_RSI;
  Boxed_Value *in_stack_ffffffffffffff98;
  Return_Value *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  Dispatch_State *in_stack_ffffffffffffffd0;
  AST_Node *in_stack_ffffffffffffffd8;
  
  bVar1 = std::
          vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
          ::empty((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                   *)CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0));
  if (!bVar1) {
    this_00 = (Return_Value *)__cxa_allocate_exception(0x10);
    std::
    vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
    ::operator[]((vector<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  *)(in_RSI + 0x60),0);
    std::__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x271e4c);
    AST_Node::eval(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    eval::detail::Return_Value::Return_Value(this_00,in_stack_ffffffffffffff98);
    __cxa_throw(this_00,&eval::detail::Return_Value::typeinfo,
                eval::detail::Return_Value::~Return_Value);
  }
  t_return_value = (Boxed_Value *)__cxa_allocate_exception(0x10);
  Boxed_Value::Boxed_Value((Boxed_Value *)0x271ef0);
  eval::detail::Return_Value::Return_Value(in_stack_ffffffffffffffa0,t_return_value);
  __cxa_throw(t_return_value,&eval::detail::Return_Value::typeinfo,
              eval::detail::Return_Value::~Return_Value);
}

Assistant:

virtual Boxed_Value eval_internal(const chaiscript::detail::Dispatch_State &t_ss) const CHAISCRIPT_OVERRIDE{
          if (!this->children.empty()) {
            throw detail::Return_Value(children[0]->eval(t_ss));
          }
          else {
            throw detail::Return_Value(Boxed_Value());
          }
        }